

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_arrow_collector.cpp
# Opt level: O1

SinkCombineResultType __thiscall
duckdb::PhysicalArrowCollector::Combine
          (PhysicalArrowCollector *this,ExecutionContext *context,OperatorSinkCombineInput *input)

{
  pthread_mutex_t *__mutex;
  GlobalSinkState *pGVar1;
  ArrowCollectorLocalState *this_00;
  int iVar2;
  
  pGVar1 = input->global_state;
  this_00 = (ArrowCollectorLocalState *)input->local_state;
  if (((this_00->finished_arrays).
       super_vector<duckdb::unique_ptr<duckdb::ArrowArrayWrapper,_std::default_delete<duckdb::ArrowArrayWrapper>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ArrowArrayWrapper,_std::default_delete<duckdb::ArrowArrayWrapper>,_true>_>_>
       .
       super__Vector_base<duckdb::unique_ptr<duckdb::ArrowArrayWrapper,_std::default_delete<duckdb::ArrowArrayWrapper>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ArrowArrayWrapper,_std::default_delete<duckdb::ArrowArrayWrapper>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       (this_00->finished_arrays).
       super_vector<duckdb::unique_ptr<duckdb::ArrowArrayWrapper,_std::default_delete<duckdb::ArrowArrayWrapper>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ArrowArrayWrapper,_std::default_delete<duckdb::ArrowArrayWrapper>,_true>_>_>
       .
       super__Vector_base<duckdb::unique_ptr<duckdb::ArrowArrayWrapper,_std::default_delete<duckdb::ArrowArrayWrapper>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ArrowArrayWrapper,_std::default_delete<duckdb::ArrowArrayWrapper>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) ||
     ((this_00->appender).
      super_unique_ptr<duckdb::ArrowAppender,_std::default_delete<duckdb::ArrowAppender>_>._M_t.
      super___uniq_ptr_impl<duckdb::ArrowAppender,_std::default_delete<duckdb::ArrowAppender>_>._M_t
      .super__Tuple_impl<0UL,_duckdb::ArrowAppender_*,_std::default_delete<duckdb::ArrowAppender>_>.
      super__Head_base<0UL,_duckdb::ArrowAppender_*,_false>._M_head_impl != (ArrowAppender *)0x0)) {
    if ((this_00->appender).
        super_unique_ptr<duckdb::ArrowAppender,_std::default_delete<duckdb::ArrowAppender>_>._M_t.
        super___uniq_ptr_impl<duckdb::ArrowAppender,_std::default_delete<duckdb::ArrowAppender>_>.
        _M_t.
        super__Tuple_impl<0UL,_duckdb::ArrowAppender_*,_std::default_delete<duckdb::ArrowAppender>_>
        .super__Head_base<0UL,_duckdb::ArrowAppender_*,_false>._M_head_impl != (ArrowAppender *)0x0)
    {
      ArrowCollectorLocalState::FinishArray(this_00);
    }
    __mutex = (pthread_mutex_t *)
              ((long)&pGVar1[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex +
              0x10);
    iVar2 = pthread_mutex_lock(__mutex);
    if (iVar2 != 0) {
      ::std::__throw_system_error(iVar2);
    }
    ::std::
    vector<duckdb::unique_ptr<duckdb::ArrowArrayWrapper,std::default_delete<duckdb::ArrowArrayWrapper>,true>,std::allocator<duckdb::unique_ptr<duckdb::ArrowArrayWrapper,std::default_delete<duckdb::ArrowArrayWrapper>,true>>>
    ::
    _M_range_insert<std::move_iterator<__gnu_cxx::__normal_iterator<duckdb::unique_ptr<duckdb::ArrowArrayWrapper,std::default_delete<duckdb::ArrowArrayWrapper>,true>*,std::vector<duckdb::unique_ptr<duckdb::ArrowArrayWrapper,std::default_delete<duckdb::ArrowArrayWrapper>,true>,std::allocator<duckdb::unique_ptr<duckdb::ArrowArrayWrapper,std::default_delete<duckdb::ArrowArrayWrapper>,true>>>>>>
              ((vector<duckdb::unique_ptr<duckdb::ArrowArrayWrapper,std::default_delete<duckdb::ArrowArrayWrapper>,true>,std::allocator<duckdb::unique_ptr<duckdb::ArrowArrayWrapper,std::default_delete<duckdb::ArrowArrayWrapper>,true>>>
                *)&pGVar1[1].super_StateWithBlockableTasks,
               pGVar1[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__align,
               (this_00->finished_arrays).
               super_vector<duckdb::unique_ptr<duckdb::ArrowArrayWrapper,_std::default_delete<duckdb::ArrowArrayWrapper>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ArrowArrayWrapper,_std::default_delete<duckdb::ArrowArrayWrapper>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::ArrowArrayWrapper,_std::default_delete<duckdb::ArrowArrayWrapper>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ArrowArrayWrapper,_std::default_delete<duckdb::ArrowArrayWrapper>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (this_00->finished_arrays).
               super_vector<duckdb::unique_ptr<duckdb::ArrowArrayWrapper,_std::default_delete<duckdb::ArrowArrayWrapper>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ArrowArrayWrapper,_std::default_delete<duckdb::ArrowArrayWrapper>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::ArrowArrayWrapper,_std::default_delete<duckdb::ArrowArrayWrapper>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ArrowArrayWrapper,_std::default_delete<duckdb::ArrowArrayWrapper>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    ::std::
    vector<duckdb::unique_ptr<duckdb::ArrowArrayWrapper,_std::default_delete<duckdb::ArrowArrayWrapper>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ArrowArrayWrapper,_std::default_delete<duckdb::ArrowArrayWrapper>,_true>_>_>
    ::_M_erase_at_end(&(this_00->finished_arrays).
                       super_vector<duckdb::unique_ptr<duckdb::ArrowArrayWrapper,_std::default_delete<duckdb::ArrowArrayWrapper>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ArrowArrayWrapper,_std::default_delete<duckdb::ArrowArrayWrapper>,_true>_>_>
                      ,(this_00->finished_arrays).
                       super_vector<duckdb::unique_ptr<duckdb::ArrowArrayWrapper,_std::default_delete<duckdb::ArrowArrayWrapper>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ArrowArrayWrapper,_std::default_delete<duckdb::ArrowArrayWrapper>,_true>_>_>
                       .
                       super__Vector_base<duckdb::unique_ptr<duckdb::ArrowArrayWrapper,_std::default_delete<duckdb::ArrowArrayWrapper>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ArrowArrayWrapper,_std::default_delete<duckdb::ArrowArrayWrapper>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
    pGVar1[2]._vptr_GlobalSinkState =
         (_func_int **)((long)pGVar1[2]._vptr_GlobalSinkState + this_00->tuple_count);
    pthread_mutex_unlock(__mutex);
  }
  return FINISHED;
}

Assistant:

SinkCombineResultType PhysicalArrowCollector::Combine(ExecutionContext &context,
                                                      OperatorSinkCombineInput &input) const {
	auto &gstate = input.global_state.Cast<ArrowCollectorGlobalState>();
	auto &lstate = input.local_state.Cast<ArrowCollectorLocalState>();
	auto &last_appender = lstate.appender;
	auto &arrays = lstate.finished_arrays;
	if (arrays.empty() && !last_appender) {
		// Nothing to do
		return SinkCombineResultType::FINISHED;
	}
	if (last_appender) {
		// FIXME: we could set these aside and merge them in a finalize event in an effort to create more balanced
		// chunks out of these remnants
		lstate.FinishArray();
	}
	// Collect all the finished arrays
	lock_guard<mutex> l(gstate.glock);
	// Move the arrays from our local state into the global state
	gstate.chunks.insert(gstate.chunks.end(), std::make_move_iterator(arrays.begin()),
	                     std::make_move_iterator(arrays.end()));
	arrays.clear();
	gstate.tuple_count += lstate.tuple_count;
	return SinkCombineResultType::FINISHED;
}